

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_man.cpp
# Opt level: O0

int __thiscall FScanner::MatchString(FScanner *this,char **strings,size_t stride)

{
  bool bVar1;
  int local_2c;
  int i;
  size_t stride_local;
  char **strings_local;
  FScanner *this_local;
  
  if ((stride & 7) != 0) {
    __assert_fail("stride % sizeof(const char*) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/sc_man.cpp"
                  ,0x345,"int FScanner::MatchString(const char *const *, size_t)");
  }
  local_2c = 0;
  stride_local = (size_t)strings;
  while( true ) {
    if (*(long *)stride_local == 0) {
      return -1;
    }
    bVar1 = Compare(this,*(char **)stride_local);
    if (bVar1) break;
    stride_local = (stride & 0xfffffffffffffff8) + stride_local;
    local_2c = local_2c + 1;
  }
  return local_2c;
}

Assistant:

int FScanner::MatchString (const char * const *strings, size_t stride)
{
	int i;

	assert(stride % sizeof(const char*) == 0);

	stride /= sizeof(const char*);

	for (i = 0; *strings != NULL; i++)
	{
		if (Compare (*strings))
		{
			return i;
		}
		strings += stride;
	}
	return -1;
}